

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O2

int rw::PluginList::close(int __fd)

{
  long *plVar1;
  undefined4 *puVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  
  plVar5 = allPlugins;
  while ((long **)plVar5 != &allPlugins) {
    plVar1 = (long *)*plVar5;
    puVar2 = (undefined4 *)plVar5[-3];
    lVar3 = plVar5[-2];
    plVar4 = (long *)plVar5[-1];
    *plVar4 = lVar3;
    *(long **)(lVar3 + 8) = plVar4;
    lVar3 = *plVar5;
    plVar4 = (long *)plVar5[1];
    *plVar4 = lVar3;
    *(long **)(lVar3 + 8) = plVar4;
    (*DAT_00144da0)(plVar5 + -0xd);
    plVar5 = plVar1;
    if (*(undefined4 **)(puVar2 + 2) == puVar2 + 2) {
      *puVar2 = puVar2[1];
    }
  }
  return 0x145150;
}

Assistant:

void
PluginList::close(void)
{
	PluginList *l;
	Plugin *p;
	FORLIST(lnk, allPlugins){
		p = LLLinkGetData(lnk, Plugin, inGlobalList);
		l = p->parentList;
		p->inParentList.remove();
		p->inGlobalList.remove();
		rwFree(p);
		if(l->plugins.isEmpty())
			l->size = l->defaultSize;
	}
	assert(allPlugins.isEmpty());
}